

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_time.c
# Opt level: O0

int get_time_ns(timespec *ts)

{
  int iVar1;
  int err;
  timespec *ts_local;
  
  iVar1 = clock_gettime(time_basis,(timespec *)ts);
  return iVar1;
}

Assistant:

int get_time_ns(struct timespec* ts)
{
    int err;

#ifdef __MACH__
    clock_serv_t cclock;
    mach_timespec_t mts;
    err = host_get_clock_service(mach_host_self(), CALENDAR_CLOCK, &cclock);
    if (!err)
    {
        err = clock_get_time(cclock, &mts);
        mach_port_deallocate(mach_task_self(), cclock);

        if (!err)
        {
            ts->tv_sec = mts.tv_sec;
            ts->tv_nsec = mts.tv_nsec;
        }
    }
#else
    err = clock_gettime(time_basis, ts);
#endif
    return err;
}